

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsubcmesh.cpp
# Opt level: O1

void __thiscall TPZSubCompMesh::TPZSubCompMesh(TPZSubCompMesh *this,TPZCompMesh *mesh)

{
  _Rb_tree_header *p_Var1;
  TPZReference *pTVar2;
  
  *(undefined ***)&this->super_TPZCompMesh = &PTR__TPZSavable_019495f8;
  TPZCompMesh::TPZCompMesh(&this->super_TPZCompMesh,&PTR_PTR_01949078,mesh->fReference,false);
  TPZCompEl::TPZCompEl
            (&this->super_TPZCompEl,&PTR_construction_vtable_96__01949088,mesh,(TPZGeoEl *)0x0);
  *(undefined ***)&this->super_TPZCompMesh = &PTR__TPZSubCompMesh_01948c18;
  *(undefined ***)&this->super_TPZCompEl = &PTR__TPZSubCompMesh_01948e28;
  pTVar2 = (TPZReference *)operator_new(0x10);
  pTVar2->fPointer = (TPZLinearAnalysis *)0x0;
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fAnalysis).fRef = pTVar2;
  TPZManVector<long,_10>::TPZManVector(&this->fConnectIndex,0);
  TPZManVector<long,_10>::TPZManVector(&this->fExternalLocIndex,0);
  p_Var1 = &(this->fFatherToLocal)._M_t._M_impl.super__Rb_tree_header;
  (this->fFatherToLocal)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fFatherToLocal)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fFatherToLocal)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fFatherToLocal)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fFatherToLocal)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->fSingularConnect = -1;
  (this->fLagrangeEquations).
  super__List_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->fLagrangeEquations;
  (this->fLagrangeEquations).
  super__List_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->fLagrangeEquations;
  (this->fLagrangeEquations).
  super__List_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl._M_node.
  _M_size = 0;
  (this->super_TPZCompMesh).fDimModel = mesh->fDimModel;
  TPZAutoPointer<TPZLinearAnalysis>::operator=(&this->fAnalysis,(TPZLinearAnalysis *)0x0);
  return;
}

Assistant:

TPZSubCompMesh::TPZSubCompMesh(TPZCompMesh &mesh) : TPZRegisterClassId(&TPZSubCompMesh::ClassId), TPZCompMesh(mesh.Reference()), TPZCompEl(mesh,0),
fSingularConnect(-1) {
    SetDimModel(mesh.Dimension());
	fAnalysis = NULL;
	
}